

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O0

void Vec_VecPush(Vec_Vec_t *p,int Level,void *Entry)

{
  Vec_Ptr_t *pVVar1;
  int local_24;
  int i;
  void *Entry_local;
  int Level_local;
  Vec_Vec_t *p_local;
  
  if (p->nSize < Level + 1) {
    Vec_PtrGrow((Vec_Ptr_t *)p,Level + 1);
    for (local_24 = p->nSize; local_24 < Level + 1; local_24 = local_24 + 1) {
      pVVar1 = Vec_PtrAlloc(0);
      p->pArray[local_24] = pVVar1;
    }
    p->nSize = Level + 1;
  }
  pVVar1 = Vec_VecEntry(p,Level);
  Vec_PtrPush(pVVar1,Entry);
  return;
}

Assistant:

static inline void Vec_VecPush( Vec_Vec_t * p, int Level, void * Entry )
{
    if ( p->nSize < Level + 1 )
    {
        int i;
        Vec_PtrGrow( (Vec_Ptr_t *)p, Level + 1 );
        for ( i = p->nSize; i < Level + 1; i++ )
            p->pArray[i] = Vec_PtrAlloc( 0 );
        p->nSize = Level + 1;
    }
    Vec_PtrPush( Vec_VecEntry(p, Level), Entry );
}